

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

rrb<char,_false,_6> *
immutable::rrb_details::rrb_tail_push<char,false,6>
          (ref<immutable::rrb<char,_false,_6>_> *in,char element)

{
  rrb<char,_false,_6> *prVar1;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_30;
  leaf_node<char,_false> *local_28;
  leaf_node<char,_false> *new_tail;
  rrb<char,_false,_6> *new_rrb;
  ref<immutable::rrb<char,_false,_6>_> *prStack_10;
  char element_local;
  ref<immutable::rrb<char,_false,_6>_> *in_local;
  
  new_rrb._7_1_ = element;
  prStack_10 = in;
  new_tail = (leaf_node<char,_false> *)rrb_head_clone<char,false,6>(in->ptr);
  prVar1 = ref<immutable::rrb<char,_false,_6>_>::operator->(prStack_10);
  local_28 = leaf_node_inc<char,false>((prVar1->tail).ptr);
  local_28->child[new_tail->_ref_count] = new_rrb._7_1_;
  new_tail->type = new_tail->type + INTERNAL_NODE;
  new_tail->_ref_count = new_tail->_ref_count + 1;
  ref<immutable::rrb_details::leaf_node<char,_false>_>::ref(&local_30,local_28);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=
            ((ref<immutable::rrb_details::leaf_node<char,_false>_> *)&new_tail->child,&local_30);
  ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_30);
  return (rrb<char,_false,_6> *)new_tail;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_tail_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
      {
      rrb<T, atomic_ref_counting, N>* new_rrb = rrb_head_clone(in.ptr);
      leaf_node<T, atomic_ref_counting>* new_tail = leaf_node_inc(in->tail.ptr);
      new_tail->child[new_rrb->tail_len] = std::move(element);
      new_rrb->cnt++;
      new_rrb->tail_len++;
      new_rrb->tail = new_tail;
      return new_rrb;
      }